

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O0

void __thiscall Date::add_year(Date *this,int n)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  int local_14;
  Date *pDStack_10;
  int n_local;
  Date *this_local;
  
  local_14 = n;
  pDStack_10 = this;
  if (n < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"add_year() - negative argument passed",&local_39);
    error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  if ((this->m == feb) && (this->d == 0x1d)) {
    bVar1 = is_leap(this->y + local_14);
    if (!bVar1) {
      this->m = mar;
      this->d = 1;
    }
  }
  this->y = local_14 + this->y;
  return;
}

Assistant:

void Date::add_year(int n)
{
	if (n <= 0)
		error("add_year() - negative argument passed");
	if (m == Month::feb && d == 29 && !is_leap(y + n))
	{
		m = Month::mar;
		d = 1;
	}
	y += n;
}